

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O0

void amrex::DistributionMapping::ComputeDistributionMappingEfficiency
               (DistributionMapping *dm,Vector<double,_std::allocator<double>_> *cost,
               Real *efficiency)

{
  longdouble x;
  long lVar1;
  Long LVar2;
  int *piVar3;
  literals *plVar4;
  double *pdVar5;
  double *in_RDX;
  double dVar6;
  Real rwSum;
  int i_3;
  Vector<double,_std::allocator<double>_> rankToCost;
  Real maxCost;
  int i_2;
  int i_1;
  int i;
  Vector<int,_std::allocator<int>_> cnt;
  Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  rankToCosts;
  int nprocs;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  undefined2 in_stack_fffffffffffffe90;
  undefined2 uVar7;
  undefined6 in_stack_fffffffffffffe92;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe98;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffea0;
  size_type in_stack_fffffffffffffeb8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec0;
  double local_a8;
  int local_a0;
  literals local_98 [24];
  double local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_1c;
  double *local_18;
  
  local_18 = in_RDX;
  local_1c = ParallelDescriptor::NProcs();
  std::allocator<amrex::Vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<amrex::Vector<double,_std::allocator<double>_>_> *)0xf5aed0);
  Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  ::vector((Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
            *)CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90),
           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),(allocator_type *)0xf5aeed)
  ;
  std::allocator<amrex::Vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<amrex::Vector<double,_std::allocator<double>_>_> *)0xf5aefc);
  std::allocator<int>::allocator((allocator<int> *)0xf5af21);
  Vector<int,_std::allocator<int>_>::vector
            ((Vector<int,_std::allocator<int>_> *)
             CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90),
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             (allocator_type *)0xf5af3e);
  std::allocator<int>::~allocator((allocator<int> *)0xf5af4d);
  local_70 = 0;
  while( true ) {
    lVar1 = (long)local_70;
    LVar2 = size((DistributionMapping *)0xf5af75);
    if (LVar2 <= lVar1) break;
    operator[]((DistributionMapping *)CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe8c);
    piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)
                        CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90),
                        CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    *piVar3 = *piVar3 + 1;
    local_70 = local_70 + 1;
  }
  local_74 = 0;
  while( true ) {
    lVar1 = (long)local_74;
    LVar2 = Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
            ::size((Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                    *)0xf5b03b);
    if (LVar2 <= lVar1) break;
    Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
    ::operator[]((Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                  *)CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90),
                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    Vector<int,_std::allocator<int>_>::operator[]
              ((Vector<int,_std::allocator<int>_> *)
               CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90),
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    std::vector<double,_std::allocator<double>_>::reserve
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    local_74 = local_74 + 1;
  }
  local_78 = 0;
  while( true ) {
    lVar1 = (long)local_78;
    LVar2 = Vector<double,_std::allocator<double>_>::size
                      ((Vector<double,_std::allocator<double>_> *)0xf5b0dc);
    if (LVar2 <= lVar1) break;
    operator[]((DistributionMapping *)CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe8c);
    Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
    ::operator[]((Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                  *)CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90),
                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    Vector<double,_std::allocator<double>_>::operator[]
              ((Vector<double,_std::allocator<double>_> *)
               CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90),
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffea0._M_current,
               in_stack_fffffffffffffe98._M_current);
    local_78 = local_78 + 1;
  }
  local_80 = -1.0;
  std::allocator<double>::allocator((allocator<double> *)0xf5b17f);
  Vector<double,_std::allocator<double>_>::vector
            ((Vector<double,_std::allocator<double>_> *)
             CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90),
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             (allocator_type *)0xf5b196);
  std::allocator<double>::~allocator((allocator<double> *)0xf5b1a5);
  for (local_a0 = 0; local_a0 < local_1c; local_a0 = local_a0 + 1) {
    Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
    ::operator[]((Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                  *)CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90),
                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    plVar4 = (literals *)
             Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
             ::operator[]((Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                           *)CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90),
                          CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    x = (longdouble)0;
    in_stack_fffffffffffffe88 = SUB104(x,0);
    in_stack_fffffffffffffe8c = (int)((unkuint10)x >> 0x20);
    in_stack_fffffffffffffe90 = (undefined2)((unkuint10)x >> 0x40);
    literals::operator____rt(plVar4,x);
    dVar6 = std::
            accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                      (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                       (double)CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90));
    local_a8 = dVar6;
    pdVar5 = Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)
                        CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90),
                        CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    *pdVar5 = dVar6;
    pdVar5 = std::max<double>(&local_80,&local_a8);
    local_80 = *pdVar5;
  }
  plVar4 = local_98;
  std::vector<double,_std::allocator<double>_>::begin
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::vector<double,_std::allocator<double>_>::end
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  uVar7 = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
  literals::operator____rt(plVar4,(longdouble)0);
  dVar6 = std::
          accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                    (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                     (double)CONCAT62(in_stack_fffffffffffffe92,uVar7));
  *local_18 = dVar6 / ((double)local_1c * local_80);
  Vector<double,_std::allocator<double>_>::~Vector
            ((Vector<double,_std::allocator<double>_> *)0xf5b3ac);
  Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0xf5b3b9);
  Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  ::~Vector((Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
             *)0xf5b3c6);
  return;
}

Assistant:

void
DistributionMapping::ComputeDistributionMappingEfficiency (const DistributionMapping& dm,
                                                           const Vector<Real>& cost,
                                                           Real* efficiency)
{
    const int nprocs = ParallelDescriptor::NProcs();

    // This will store mapping from processor to the costs of FABs it controls,
    // (proc) --> ([cost_FAB_1, cost_FAB_2, ... ]),
    // for each proc
    Vector<Vector<Real>> rankToCosts(nprocs);

    // Count the number of costs belonging to each rank
    Vector<int> cnt(nprocs);
    for (int i=0; i<dm.size(); ++i)
    {
        ++cnt[dm[i]];
    }

    for (int i=0; i<rankToCosts.size(); ++i)
    {
        rankToCosts[i].reserve(cnt[i]);
    }

    for (int i=0; i<cost.size(); ++i)
    {
        rankToCosts[dm[i]].push_back(cost[i]);
    }

    Real maxCost = -1.0;

    // This will store mapping from (proc) --> (sum of cost) for each proc
    Vector<Real> rankToCost(nprocs);
    for (int i=0; i<nprocs; ++i)
    {
        const Real rwSum = std::accumulate(rankToCosts[i].begin(),
                                           rankToCosts[i].end(), 0.0_rt);
        rankToCost[i] = rwSum;
        maxCost = std::max(maxCost, rwSum);
    }

    // Write `efficiency` (number between 0 and 1), the mean cost per processor
    // (normalized to the max cost)
    *efficiency = (std::accumulate(rankToCost.begin(),
                                   rankToCost.end(), 0.0_rt) / (nprocs*maxCost));
}